

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Maj_ManMarkup(Maj_Man_t_conflict *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  int local_1e4;
  uint local_1a8;
  uint local_1a4;
  int m;
  int j;
  int k;
  int i;
  int VarCons [32] [3];
  Maj_Man_t_conflict *p_local;
  
  VarCons[0x1f]._4_8_ = p;
  memset(&k,0,0x180);
  *(undefined4 *)(VarCons[0x1f]._4_8_ + 0x10) = 1;
  if (*(int *)(VarCons[0x1f]._4_8_ + 8) < 0x21) {
    if (*(int *)(VarCons[0x1f]._4_8_ + 0x1c) != 0) {
      Maj_ManConnect((int (*) [3])&k,*(int *)VarCons[0x1f]._4_8_,*(int *)(VarCons[0x1f]._4_8_ + 8),
                     *(int *)(VarCons[0x1f]._4_8_ + 0x20),*(int *)(VarCons[0x1f]._4_8_ + 0x24));
    }
    iVar3 = *(int *)VarCons[0x1f]._4_8_;
    for (m = 0; m < 3; m = m + 1) {
      pVVar1 = *(Vec_Wec_t **)(VarCons[0x1f]._4_8_ + 0x30b8);
      iVar2 = Abc_Var2Lit(*(int *)(VarCons[0x1f]._4_8_ + 0x10),0);
      Vec_WecPush(pVVar1,4 - m,iVar2);
      iVar2 = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
      *(int *)(VarCons[0x1f]._4_8_ + 0x10) = iVar2 + 1;
      *(int *)(VarCons[0x1f]._4_8_ + 0x30 + (long)(iVar3 + 2) * 0x180 + (long)m * 0x80 +
              (long)(4 - m) * 4) = iVar2;
    }
    for (j = *(int *)VarCons[0x1f]._4_8_ + 3; j < *(int *)(VarCons[0x1f]._4_8_ + 8); j = j + 1) {
      for (m = 0; m < 3; m = m + 1) {
        if ((*(int *)(VarCons[0x1f]._4_8_ + 0x18) == 0) || (m != 0)) {
          if ((*(int *)(VarCons[0x1f]._4_8_ + 0x1c) == 0) || ((&k)[(long)j * 3 + (long)m] < 1)) {
            local_1a4 = 2;
            if (*(int *)(VarCons[0x1f]._4_8_ + 0x14) != 0 && m == 2) {
              local_1a4 = 0;
            }
            while( true ) {
              if (*(int *)(VarCons[0x1f]._4_8_ + 0x1c) == 0) {
                local_1e4 = j - m;
              }
              else {
                local_1e4 = (*(int *)VarCons[0x1f]._4_8_ + 2) - m;
              }
              if (local_1e4 <= (int)local_1a4) break;
              pVVar1 = *(Vec_Wec_t **)(VarCons[0x1f]._4_8_ + 0x30b8);
              iVar3 = Abc_Var2Lit(*(int *)(VarCons[0x1f]._4_8_ + 0x10),0);
              Vec_WecPush(pVVar1,local_1a4,iVar3);
              iVar3 = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
              *(int *)(VarCons[0x1f]._4_8_ + 0x10) = iVar3 + 1;
              *(int *)(VarCons[0x1f]._4_8_ + 0x30 + (long)j * 0x180 + (long)m * 0x80 +
                      (long)(int)local_1a4 * 4) = iVar3;
              local_1a4 = local_1a4 + 1;
            }
          }
          else {
            iVar3 = (&k)[(long)j * 3 + (long)m];
            pVVar1 = *(Vec_Wec_t **)(VarCons[0x1f]._4_8_ + 0x30b8);
            iVar2 = Abc_Var2Lit(*(int *)(VarCons[0x1f]._4_8_ + 0x10),0);
            Vec_WecPush(pVVar1,iVar3,iVar2);
            iVar2 = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
            *(int *)(VarCons[0x1f]._4_8_ + 0x10) = iVar2 + 1;
            *(int *)(VarCons[0x1f]._4_8_ + 0x30 + (long)j * 0x180 + (long)m * 0x80 + (long)iVar3 * 4
                    ) = iVar2;
          }
        }
        else {
          pVVar1 = *(Vec_Wec_t **)(VarCons[0x1f]._4_8_ + 0x30b8);
          iVar3 = Abc_Var2Lit(*(int *)(VarCons[0x1f]._4_8_ + 0x10),0);
          Vec_WecPush(pVVar1,j + -1,iVar3);
          iVar3 = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
          *(int *)(VarCons[0x1f]._4_8_ + 0x10) = iVar3 + 1;
          *(int *)(VarCons[0x1f]._4_8_ + 0x30 + (long)j * 0x180 + (long)(j + -1) * 4) = iVar3;
        }
      }
    }
    printf("The number of parameter variables = %d.\n",(ulong)*(uint *)(VarCons[0x1f]._4_8_ + 0x10))
    ;
    if (*(int *)(VarCons[0x1f]._4_8_ + 0x24) == 0) {
      p_local._4_4_ = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
    }
    else {
      printf("     ");
      for (j = *(int *)VarCons[0x1f]._4_8_ + 2; j < *(int *)(VarCons[0x1f]._4_8_ + 8); j = j + 1) {
        printf("   Node %2d    ",(ulong)(uint)j);
      }
      printf("\n");
      for (local_1a8 = 0; (int)local_1a8 < *(int *)(VarCons[0x1f]._4_8_ + 8);
          local_1a8 = local_1a8 + 1) {
        printf("%2d : ",(ulong)local_1a8);
        for (j = *(int *)VarCons[0x1f]._4_8_ + 2; j < *(int *)(VarCons[0x1f]._4_8_ + 8); j = j + 1)
        {
          for (local_1a4 = 0; (int)local_1a4 < *(int *)(VarCons[0x1f]._4_8_ + 8);
              local_1a4 = local_1a4 + 1) {
            if (local_1a4 == local_1a8) {
              for (m = 0; m < 3; m = m + 1) {
                if (*(int *)(VarCons[0x1f]._4_8_ + 0x30 + (long)j * 0x180 + (long)m * 0x80 +
                            (long)(int)local_1a4 * 4) == 0) {
                  printf("%3c ",0x2e);
                }
                else {
                  printf("%3d ",(ulong)*(uint *)(VarCons[0x1f]._4_8_ + 0x30 + (long)j * 0x180 +
                                                 (long)m * 0x80 + (long)(int)local_1a4 * 4));
                }
              }
              printf("  ");
            }
          }
        }
        printf("\n");
      }
      p_local._4_4_ = *(int *)(VarCons[0x1f]._4_8_ + 0x10);
    }
    return p_local._4_4_;
  }
  __assert_fail("p->nObjs <= MAJ_NOBJS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                ,0xa1,"int Maj_ManMarkup(Maj_Man_t *)");
}

Assistant:

int Maj_ManMarkup( Maj_Man_t * p )
{
    int i, k, j;
    p->iVar = 1;
    assert( p->nObjs <= MAJ_NOBJS );
    // make exception for the first node
    i = p->nVars + 2;
    for ( k = 0; k < 3; k++ )
    {
        j = 4-k;
        Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
        p->VarMarks[i][k][j] = p->iVar++;
    }
    // assign variables for other nodes
    for ( i = p->nVars + 3; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            if ( p->fUseLine && k == 0 )
            {
                j = i-1;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = (p->fUseConst && k == 2) ? 0 : 2; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 3; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}